

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_minc2(CImg<unsigned_char> *this,char *filename)

{
  CImg<unsigned_char> *pCVar1;
  CImgArgumentException *this_00;
  char *pcVar2;
  
  if (filename != (char *)0x0) {
    pCVar1 = load_other(this,filename);
    return pCVar1;
  }
  this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
  pcVar2 = "non-";
  if (this->_is_shared != false) {
    pcVar2 = "";
  }
  CImgArgumentException::CImgArgumentException
            (this_00,
             "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_minc2(): Specified filename is (null)."
             ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
             this->_data,pcVar2,"unsigned char");
  __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
}

Assistant:

CImg<T>& load_minc2(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_minc2(): Specified filename is (null).",
                                    cimg_instance);
#ifndef cimg_use_minc2
      return load_other(filename);
#else
      minc::minc_1_reader rdr;
      rdr.open(filename);
      assign(rdr.ndim(1)?rdr.ndim(1):1,
             rdr.ndim(2)?rdr.ndim(2):1,
             rdr.ndim(3)?rdr.ndim(3):1,
             rdr.ndim(4)?rdr.ndim(4):1);
      if(typeid(T)==typeid(unsigned char))
        rdr.setup_read_byte();
      else if(typeid(T)==typeid(int))
        rdr.setup_read_int();
      else if(typeid(T)==typeid(double))
        rdr.setup_read_double();
      else
        rdr.setup_read_float();
      minc::load_standard_volume(rdr, this->_data);
      return *this;
#endif
    }